

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageStringUp(gdImagePtr im,gdFontPtr f,int x,int y,uchar *s,int color)

{
  size_t sVar1;
  int local_30;
  int l;
  int i;
  int color_local;
  uchar *s_local;
  int y_local;
  int x_local;
  gdFontPtr f_local;
  gdImagePtr im_local;
  
  sVar1 = strlen((char *)s);
  s_local._0_4_ = y;
  for (local_30 = 0; local_30 < (int)sVar1; local_30 = local_30 + 1) {
    gdImageCharUp(im,f,x,(int)s_local,(uint)s[local_30],color);
    s_local._0_4_ = (int)s_local - f->w;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageStringUp (gdImagePtr im, gdFontPtr f,
								   int x, int y, unsigned char *s, int color)
{
	int i;
	int l;
	l = strlen ((char *) s);
	for (i = 0; (i < l); i++) {
		gdImageCharUp (im, f, x, y, s[i], color);
		y -= f->w;
	}
}